

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O1

optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> * __thiscall
libtorrent::http_parser::header_duration
          (optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> *__return_storage_ptr__,
          http_parser *this,string_view key)

{
  bool bVar1;
  const_iterator cVar2;
  long lVar3;
  key_type local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,key.ptr_,key.ptr_ + key.len_);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_header)._M_t,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar2._M_node != &(this->m_header)._M_t._M_impl.super__Rb_tree_header) {
    lVar3 = atol(*(char **)(cVar2._M_node + 2));
    if (0 < lVar3) {
      (__return_storage_ptr__->super_type).m_initialized = false;
      (__return_storage_ptr__->super_type).m_storage.dummy_ = SUB84(lVar3,0);
      bVar1 = true;
      goto LAB_001e0eec;
    }
  }
  bVar1 = false;
LAB_001e0eec:
  (__return_storage_ptr__->super_type).m_initialized = bVar1;
  return __return_storage_ptr__;
}

Assistant:

boost::optional<seconds32> http_parser::header_duration(string_view const key) const
	{
		// TODO: remove to_string() if we're in C++14
		auto const i = m_header.find(key.to_string());
		if (i == m_header.end()) return boost::none;
		auto const val = std::atol(i->second.c_str());
		if (val <= 0) return boost::none;
		return seconds32(val);
	}